

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-linked_ptr.h
# Opt level: O1

bool __thiscall testing::internal::linked_ptr_internal::depart(linked_ptr_internal *this)

{
  linked_ptr_internal *plVar1;
  linked_ptr_internal *plVar2;
  linked_ptr_internal *plVar3;
  
  MutexBase::Lock((MutexBase *)g_linked_ptr_mutex);
  plVar1 = this->next_;
  plVar3 = plVar1;
  if (plVar1 != this) {
    while (plVar2 = plVar3->next_, plVar2 != this) {
      plVar3 = plVar2;
      if (plVar2 == plVar1) {
        __assert_fail("p->next_ != next_ && \"Trying to depart() a linked ring we are not in. \" \"Is GMock thread safety enabled?\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/build_O1/_deps/googletest-src/googletest/include/gtest/internal/gtest-linked_ptr.h"
                      ,0x86,"bool testing::internal::linked_ptr_internal::depart()");
      }
    }
    plVar3->next_ = plVar1;
  }
  MutexBase::Unlock((MutexBase *)g_linked_ptr_mutex);
  return plVar1 == this;
}

Assistant:

bool depart()
      GTEST_LOCK_EXCLUDED_(g_linked_ptr_mutex) {
    MutexLock lock(&g_linked_ptr_mutex);

    if (next_ == this) return true;
    linked_ptr_internal const* p = next_;
    while (p->next_ != this) {
      assert(p->next_ != next_ &&
             "Trying to depart() a linked ring we are not in. "
             "Is GMock thread safety enabled?");
      p = p->next_;
    }
    p->next_ = next_;
    return false;
  }